

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O2

void __thiscall
amrex::MLLinOp::defineGrids
          (MLLinOp *this,Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *a_geom,
          Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *a_grids,
          Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *a_dmap,
          Vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
          *a_factory)

{
  Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
  *this_00;
  undefined8 *puVar1;
  int *piVar2;
  RealBox *__args_1;
  pointer pGVar3;
  pointer piVar4;
  pointer ppFVar5;
  vector<amrex::Geometry,std::allocator<amrex::Geometry>> *this_01;
  vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *pvVar6;
  vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *pvVar7;
  pointer pDVar8;
  pointer pDVar9;
  long *plVar10;
  pointer pVVar11;
  long lVar12;
  pointer pVVar13;
  double dVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined8 uVar18;
  Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
  *pVVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  undefined8 uVar23;
  bool bVar24;
  bool bVar25;
  int i_1;
  int iVar26;
  uint uVar27;
  uint uVar28;
  int extraout_var;
  int extraout_var_00;
  Long LVar29;
  Long LVar30;
  uint *puVar31;
  Long LVar32;
  ulong uVar33;
  ostream *poVar34;
  Print *pPVar35;
  int iVar36;
  int amrlev;
  uint uVar37;
  int iVar38;
  int dir;
  long lVar39;
  int dir_1;
  ulong uVar40;
  vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>,std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>>
  *pvVar41;
  byte bVar42;
  int idim_1;
  Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
  *this_02;
  int i;
  int iVar43;
  long lVar44;
  IntVect IVar45;
  IntVect IVar46;
  initializer_list<amrex::Box> __l;
  initializer_list<amrex::Box> __l_00;
  initializer_list<int> __l_01;
  initializer_list<amrex::IntVect> __l_02;
  ulong local_358;
  IntVect rr;
  uint auStack_33c [3];
  IndexType IStack_330;
  IntVect rr_vec;
  uint auStack_31c [3];
  IndexType IStack_310;
  Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
  *local_308;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *local_300;
  double local_2f8;
  IntVect is_coarsenable_1;
  int local_2d8;
  int local_2d4;
  IntVect rr_level_1;
  ulong local_2c0;
  IntVect mg_coarsen_ratio_v;
  int coord;
  Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
  *local_2a8;
  Vector<int,_std::allocator<int>_> *local_2a0;
  Box aggbox;
  IntVect rr_level;
  undefined4 uStack_25c;
  IntVect is_coarsenable;
  IntVect mg_box_min_width_v;
  array<int,_3UL> local_220;
  IntVect mg_domain_min_width_v;
  Box result;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> accum_coarsen_ratio;
  Vector<int,_std::allocator<int>_> agg_flag;
  
  iVar26 = (int)(((long)(a_geom->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                        super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(a_geom->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl
                       .super__Vector_impl_data._M_start) / 200);
  this->m_num_amr_levels = iVar26;
  local_300 = (Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)a_grids;
  std::vector<int,_std::allocator<int>_>::resize
            (&(this->m_amr_ref_ratio).super_vector<int,_std::allocator<int>_>,(long)iVar26);
  local_2a0 = &this->m_num_mg_levels;
  std::vector<int,_std::allocator<int>_>::resize
            (&local_2a0->super_vector<int,_std::allocator<int>_>,(long)this->m_num_amr_levels);
  local_2a8 = &this->m_geom;
  std::
  vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
  ::resize(&local_2a8->
            super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
           ,(long)this->m_num_amr_levels);
  local_308 = &this->m_grids;
  std::
  vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
  ::resize(&local_308->
            super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
           ,(long)this->m_num_amr_levels);
  this_02 = &this->m_dmap;
  std::
  vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
  ::resize(&this_02->
            super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
           ,(long)this->m_num_amr_levels);
  this_00 = &this->m_factory;
  std::
  vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
  ::resize(&this_00->
            super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
           ,(long)this->m_num_amr_levels);
  this->m_default_comm = *(MPI_Comm *)(DAT_006e0650 + -0x48);
  pGVar3 = (a_geom->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_start;
  coord = (pGVar3->super_CoordSys).c_sys;
  local_220._M_elems._0_8_ =
       (ulong)(byte)(pGVar3->super_CoordSys).field_0x52 << 0x20 |
       (ulong)(byte)(pGVar3->super_CoordSys).field_0x51;
  local_220._M_elems[2] = (int)(byte)(pGVar3->super_CoordSys).field_0x53;
  mg_coarsen_ratio_v.vect._0_8_ = &DAT_200000002;
  local_2d8 = 2;
  mg_box_min_width_v.vect._0_8_ = &DAT_200000002;
  mg_domain_min_width_v.vect[0] = 4;
  mg_domain_min_width_v.vect[1] = 4;
  mg_domain_min_width_v.vect[2] = 4;
  uVar37 = (this->info).hidden_direction;
  uVar27 = this->m_num_amr_levels;
  local_2d4 = local_2d8;
  mg_coarsen_ratio_v.vect[2] = local_2d8;
  mg_box_min_width_v.vect[2] = local_2d8;
  if (uVar37 < 3) {
    if (uVar27 == 1) {
      uVar27 = 1;
    }
    else {
      Assert_host("AMREX_SPACEDIM == 3 && m_num_amr_levels == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLLinOp.cpp"
                  ,0xcc,"\"Hidden direction only supported for 3d level solve\"");
      uVar37 = (this->info).hidden_direction;
      uVar27 = this->m_num_amr_levels;
    }
    mg_box_min_width_v.vect[(int)uVar37] = 0;
    mg_domain_min_width_v.vect[(int)uVar37] = 0;
    mg_coarsen_ratio_v.vect[(int)uVar37] = 1;
    local_2d8 = mg_coarsen_ratio_v.vect[0];
    local_2d4 = mg_coarsen_ratio_v.vect[1];
  }
  iVar26 = mg_coarsen_ratio_v.vect[2];
  __args_1 = &pGVar3->prob_domain;
  uVar33 = (ulong)uVar27;
  while (piVar4 = (local_2a0->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start, 1 < (int)uVar33) {
    uVar40 = uVar33 - 1;
    piVar4[uVar40] = 1;
    std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::push_back
              (&(local_2a8->
                super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                ).
                super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar40].
                super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,
               (a_geom->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_start + uVar40);
    local_2f8 = (double)(uVar40 * 0x68);
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::push_back
              (&(local_308->
                super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                ).
                super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar40].
                super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
               (((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                &local_300->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>)->
               super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>)._M_impl.
               super__Vector_impl_data._M_start + uVar40);
    std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::push_back
              (&(this_02->
                super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                ).
                super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar40].
                super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
               ,(a_dmap->
                super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                ).
                super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar40);
    ppFVar5 = (a_factory->
              super_vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
              ).
              super__Vector_base<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar41 = (vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>,std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>>
               *)((this_00->
                  super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                  ).
                  super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar40);
    if ((long)(a_factory->
              super_vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
              ).
              super__Vector_base<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar5 >> 3 < (long)uVar33) {
      std::make_unique<amrex::DefaultFabFactory<amrex::FArrayBox>>();
      uVar18 = aggbox.smallend.vect._0_8_;
      aggbox.smallend.vect[0] = 0;
      aggbox.smallend.vect[1] = 0;
      uVar23 = aggbox.smallend.vect._0_8_;
      aggbox.smallend.vect[0] = (int)uVar18;
      aggbox.smallend.vect[1] = SUB84(uVar18,4);
      result.smallend.vect[0] = aggbox.smallend.vect[0];
      result.smallend.vect[1] = aggbox.smallend.vect[1];
      aggbox.smallend.vect._0_8_ = uVar23;
      std::
      vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>,std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>>
      ::
      emplace_back<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>
                (pvVar41,(unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                          *)&result);
      if (result.smallend.vect._0_8_ != 0) {
        (**(code **)(*(long *)result.smallend.vect._0_8_ + 8))();
      }
      result.smallend.vect[0] = 0;
      result.smallend.vect[1] = 0;
      if (aggbox.smallend.vect._0_8_ != 0) {
        (**(code **)(*(long *)aggbox.smallend.vect._0_8_ + 8))();
      }
    }
    else {
      result.smallend.vect[0] = (*ppFVar5[uVar40]->_vptr_FabFactory[5])();
      result.smallend.vect[1] = extraout_var;
      std::
      vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>,std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>>
      ::emplace_back<amrex::FabFactory<amrex::FArrayBox>*>
                (pvVar41,(FabFactory<amrex::FArrayBox> **)&result);
    }
    rr.vect[2] = mg_coarsen_ratio_v.vect[2];
    rr.vect[0] = mg_coarsen_ratio_v.vect[0];
    rr.vect[1] = mg_coarsen_ratio_v.vect[1];
    pGVar3 = (a_geom->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
             super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (iVar43 = 0; iVar43 != 2; iVar43 = iVar43 + 1) {
      bVar24 = Box::coarsenable(&pGVar3[uVar40].domain,&rr,1);
      if (!bVar24) {
        Abort_host("MLLinOp: Uncoarsenable domain");
      }
      lVar39 = *(long *)pGVar3[uVar40].domain.smallend.vect;
      lVar44 = *(long *)(pGVar3[uVar40].domain.smallend.vect + 2);
      lVar12 = *(long *)pGVar3[uVar40].domain.bigend.vect;
      uVar18 = *(undefined8 *)(pGVar3[uVar40].domain.bigend.vect + 2);
      result.bigend.vect[1] = (int)((ulong)lVar12 >> 0x20);
      result.bigend.vect[2] = (int)uVar18;
      result.btype.itype = SUB84(uVar18,4);
      result.smallend.vect[2] = (int)lVar44;
      result.bigend.vect[0] = (int)((ulong)lVar44 >> 0x20);
      result.smallend.vect[1] = (int)((ulong)lVar39 >> 0x20);
      uVar37 = result.smallend.vect[1];
      if (rr.vect[1] == 1 && rr.vect[0] == 1) {
        result.smallend.vect._0_8_ = lVar39;
        if (rr.vect[2] != 1) goto LAB_004e7b4a;
      }
      else {
        result.smallend.vect[0] = (int)lVar39;
        if (rr.vect[0] != 1) {
          if (rr.vect[0] == 4) {
            if (result.smallend.vect[0] < 0) {
              result.smallend.vect[0] = result.smallend.vect[0] >> 2;
            }
            else {
              result.smallend.vect[0] = (uint)result.smallend.vect[0] >> 2;
            }
          }
          else if (rr.vect[0] == 2) {
            if (result.smallend.vect[0] < 0) {
              result.smallend.vect[0] = result.smallend.vect[0] >> 1;
            }
            else {
              result.smallend.vect[0] = (uint)result.smallend.vect[0] >> 1;
            }
          }
          else if (result.smallend.vect[0] < 0) {
            result.smallend.vect[0] = ~(~result.smallend.vect[0] / rr.vect[0]);
          }
          else {
            result.smallend.vect[0] = result.smallend.vect[0] / rr.vect[0];
          }
        }
        if (rr.vect[1] != 1) {
          if (rr.vect[1] == 4) {
            if (lVar39 < 0) {
              uVar37 = result.smallend.vect[1] >> 2;
            }
            else {
              uVar37 = (uint)result.smallend.vect[1] >> 2;
            }
          }
          else if (rr.vect[1] == 2) {
            if (lVar39 < 0) {
              uVar37 = result.smallend.vect[1] >> 1;
            }
            else {
              uVar37 = (uint)result.smallend.vect[1] >> 1;
            }
          }
          else if (lVar39 < 0) {
            uVar37 = ~(~result.smallend.vect[1] / rr.vect[1]);
          }
          else {
            uVar37 = result.smallend.vect[1] / rr.vect[1];
          }
        }
LAB_004e7b4a:
        result.smallend.vect[1] = uVar37;
        if (rr.vect[2] != 1) {
          if (rr.vect[2] == 4) {
            if (result.smallend.vect[2] < 0) {
              result.smallend.vect[2] = result.smallend.vect[2] >> 2;
            }
            else {
              result.smallend.vect[2] = (uint)result.smallend.vect[2] >> 2;
            }
          }
          else if (rr.vect[2] == 2) {
            if (result.smallend.vect[2] < 0) {
              result.smallend.vect[2] = result.smallend.vect[2] >> 1;
            }
            else {
              result.smallend.vect[2] = (uint)result.smallend.vect[2] >> 1;
            }
          }
          else if (result.smallend.vect[2] < 0) {
            result.smallend.vect[2] = ~(~result.smallend.vect[2] / rr.vect[2]);
          }
          else {
            result.smallend.vect[2] = result.smallend.vect[2] / rr.vect[2];
          }
        }
        result.btype.itype = SUB84(uVar18,4);
        result.bigend.vect[2] = (int)uVar18;
        if (result.btype.itype == 0) {
          uVar37 = result.bigend.vect[0];
          if (rr.vect[0] != 1) {
            if (rr.vect[0] == 4) {
              uVar37 = result.bigend.vect[0] >> 2;
              if (-1 < lVar44) {
                uVar37 = (uint)result.bigend.vect[0] >> 2;
              }
            }
            else if (rr.vect[0] == 2) {
              uVar37 = result.bigend.vect[0] >> 1;
              if (-1 < lVar44) {
                uVar37 = (uint)result.bigend.vect[0] >> 1;
              }
            }
            else if (lVar44 < 0) {
              uVar37 = ~(~result.bigend.vect[0] / rr.vect[0]);
            }
            else {
              uVar37 = result.bigend.vect[0] / rr.vect[0];
            }
          }
          uVar27 = result.bigend.vect[1];
          if (rr.vect[1] != 1) {
            if (rr.vect[1] == 4) {
              uVar27 = result.bigend.vect[1] >> 2;
              if (-1 < lVar12) {
                uVar27 = (uint)result.bigend.vect[1] >> 2;
              }
            }
            else if (rr.vect[1] == 2) {
              uVar27 = result.bigend.vect[1] >> 1;
              if (-1 < lVar12) {
                uVar27 = (uint)result.bigend.vect[1] >> 1;
              }
            }
            else if (lVar12 < 0) {
              uVar27 = ~(~result.bigend.vect[1] / rr.vect[1]);
            }
            else {
              uVar27 = result.bigend.vect[1] / rr.vect[1];
            }
          }
          uVar28 = result.bigend.vect[2];
          result.bigend.vect[0] = uVar37;
          result.bigend.vect[1] = uVar27;
          if (rr.vect[2] != 1) {
            if (rr.vect[2] == 4) {
              uVar28 = result.bigend.vect[2] >> 2;
              if (-1 < result.bigend.vect[2]) {
                uVar28 = (uint)result.bigend.vect[2] >> 2;
              }
            }
            else if (rr.vect[2] == 2) {
              uVar28 = result.bigend.vect[2] >> 1;
              if (-1 < result.bigend.vect[2]) {
                uVar28 = (uint)result.bigend.vect[2] >> 1;
              }
            }
            else if (result.bigend.vect[2] < 0) {
              uVar28 = ~(~result.bigend.vect[2] / rr.vect[2]);
            }
            else {
              uVar28 = result.bigend.vect[2] / rr.vect[2];
            }
          }
        }
        else {
          aggbox.smallend.vect[0] = 0;
          aggbox.smallend.vect[1] = 0;
          aggbox.smallend.vect[2] = 0;
          for (lVar39 = 0; lVar39 != 3; lVar39 = lVar39 + 1) {
            if (((result.btype.itype >> ((uint)lVar39 & 0x1f) & 1) != 0) &&
               (result.bigend.vect[lVar39] % rr.vect[lVar39] != 0)) {
              aggbox.smallend.vect[lVar39] = 1;
            }
          }
          uVar37 = result.bigend.vect[0];
          if (rr.vect[0] != 1) {
            if (rr.vect[0] == 4) {
              uVar37 = result.bigend.vect[0] >> 2;
              if (-1 < lVar44) {
                uVar37 = (uint)result.bigend.vect[0] >> 2;
              }
            }
            else if (rr.vect[0] == 2) {
              uVar37 = result.bigend.vect[0] >> 1;
              if (-1 < lVar44) {
                uVar37 = (uint)result.bigend.vect[0] >> 1;
              }
            }
            else if (lVar44 < 0) {
              uVar37 = ~(~result.bigend.vect[0] / rr.vect[0]);
            }
            else {
              uVar37 = result.bigend.vect[0] / rr.vect[0];
            }
          }
          uVar27 = result.bigend.vect[1];
          if (rr.vect[1] != 1) {
            if (rr.vect[1] == 4) {
              uVar27 = result.bigend.vect[1] >> 2;
              if (-1 < lVar12) {
                uVar27 = (uint)result.bigend.vect[1] >> 2;
              }
            }
            else if (rr.vect[1] == 2) {
              uVar27 = result.bigend.vect[1] >> 1;
              if (-1 < lVar12) {
                uVar27 = (uint)result.bigend.vect[1] >> 1;
              }
            }
            else if (lVar12 < 0) {
              uVar27 = ~(~result.bigend.vect[1] / rr.vect[1]);
            }
            else {
              uVar27 = result.bigend.vect[1] / rr.vect[1];
            }
          }
          uVar28 = result.bigend.vect[2];
          if (rr.vect[2] != 1) {
            if (rr.vect[2] == 4) {
              uVar28 = result.bigend.vect[2] >> 2;
              if (-1 < result.bigend.vect[2]) {
                uVar28 = (uint)result.bigend.vect[2] >> 2;
              }
            }
            else if (rr.vect[2] == 2) {
              uVar28 = result.bigend.vect[2] >> 1;
              if (-1 < result.bigend.vect[2]) {
                uVar28 = (uint)result.bigend.vect[2] >> 1;
              }
            }
            else if (result.bigend.vect[2] < 0) {
              uVar28 = ~(~result.bigend.vect[2] / rr.vect[2]);
            }
            else {
              uVar28 = result.bigend.vect[2] / rr.vect[2];
            }
          }
          uVar28 = uVar28 + aggbox.smallend.vect[2];
          result.bigend.vect[0] = uVar37 + aggbox.smallend.vect[0];
          result.bigend.vect[1] = uVar27 + aggbox.smallend.vect[1];
        }
        result.bigend.vect[2] = uVar28;
      }
      bVar24 = Box::operator==(&result,&(a_geom->
                                        super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                        ).
                                        super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar33 - 2].domain
                              );
      if (bVar24) break;
      piVar2 = (local_2a0->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + uVar40;
      *piVar2 = *piVar2 + 1;
      std::vector<amrex::Geometry,std::allocator<amrex::Geometry>>::
      emplace_back<amrex::Box_const&,amrex::RealBox_const&,int_const&,std::array<int,3ul>const&>
                ((vector<amrex::Geometry,std::allocator<amrex::Geometry>> *)
                 ((local_2a8->
                  super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  ).
                  super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar40),&result,__args_1,&coord,
                 &local_220);
      pVVar19 = local_308;
      std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::push_back
                (&(local_308->
                  super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                  ).
                  super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar40].
                  super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
                 (value_type *)
                 ((long)&(((((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                            &local_300->
                             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>)->
                           super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                           _M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type +
                 (long)local_2f8));
      BoxArray::coarsen((pVVar19->
                        super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                        ).
                        super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar40].
                        super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                        super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                        _M_impl.super__Vector_impl_data._M_finish + -1,&rr);
      std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
      push_back(&(this_02->
                 super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                 ).
                 super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar40].
                 super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                ,(a_dmap->
                 super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                 ).
                 super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar40);
      rr.vect[1] = rr.vect[1] * local_2d4;
      rr.vect[0] = rr.vect[0] * local_2d8;
      rr.vect[2] = rr.vect[2] * iVar26;
    }
    uVar37 = (this->info).hidden_direction;
    iVar43 = -(uVar37 - 3);
    if (2 < uVar37) {
      iVar43 = 0;
    }
    (this->m_amr_ref_ratio).super_vector<int,_std::allocator<int>_>.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [uVar33 - 2] = *(int *)((long)rr.vect + (ulong)(uint)(iVar43 << 2));
    uVar33 = uVar40;
  }
  *piVar4 = 1;
  std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::push_back
            (&((local_2a8->
               super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
               ).
               super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,
             (a_geom->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
             super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::push_back
            (&((local_308->
               super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
               ).
               super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
             (((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
              &local_300->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>)->
             super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>)._M_impl.
             super__Vector_impl_data._M_start);
  std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::push_back
            (&((this_02->
               super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
               ).
               super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,
             (a_dmap->
             super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>).
             super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
             ._M_impl.super__Vector_impl_data._M_start);
  ppFVar5 = (a_factory->
            super_vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
            ).
            super__Vector_base<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar41 = (vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>,std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>>
             *)(this_00->
               super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
               ).
               super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  if ((long)(a_factory->
            super_vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
            ).
            super__Vector_base<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar5 < 1) {
    std::make_unique<amrex::DefaultFabFactory<amrex::FArrayBox>>();
    uVar18 = aggbox.smallend.vect._0_8_;
    aggbox.smallend.vect[0] = 0;
    aggbox.smallend.vect[1] = 0;
    uVar23 = aggbox.smallend.vect._0_8_;
    aggbox.smallend.vect[0] = (int)uVar18;
    aggbox.smallend.vect[1] = SUB84(uVar18,4);
    result.smallend.vect[0] = aggbox.smallend.vect[0];
    result.smallend.vect[1] = aggbox.smallend.vect[1];
    aggbox.smallend.vect._0_8_ = uVar23;
    std::
    vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>,std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>>
    ::
    emplace_back<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>
              (pvVar41,(unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        *)&result);
    if (result.smallend.vect._0_8_ != 0) {
      (**(code **)(*(long *)result.smallend.vect._0_8_ + 8))();
    }
    result.smallend.vect[0] = 0;
    result.smallend.vect[1] = 0;
    if (aggbox.smallend.vect._0_8_ != 0) {
      (**(code **)(*(long *)aggbox.smallend.vect._0_8_ + 8))();
    }
  }
  else {
    result.smallend.vect[0] = (*(*ppFVar5)->_vptr_FabFactory[5])();
    result.smallend.vect[1] = extraout_var_00;
    std::
    vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>,std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>>
    ::emplace_back<amrex::FabFactory<amrex::FArrayBox>*>
              (pvVar41,(FabFactory<amrex::FArrayBox> **)&result);
  }
  result.smallend.vect._0_8_ = result.smallend.vect._0_8_ & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::resize
            (&(this->m_domain_covered).super_vector<int,_std::allocator<int>_>,
             (long)this->m_num_amr_levels,(value_type_conflict *)&result);
  LVar29 = BoxArray::numPts(*(BoxArray **)
                             &(((this->m_grids).
                                super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                .
                                super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                              super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>)
  ;
  compactify(&result,this,
             (Box *)(*(long *)&(((this->m_geom).
                                 super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                 .
                                 super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                    + 0xac));
  LVar30 = Box::numPts(&result);
  puVar31 = (uint *)(this->m_domain_covered).super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
  *puVar31 = (uint)(LVar29 == LVar30);
  lVar44 = 6;
  for (lVar39 = 1; (lVar39 < this->m_num_amr_levels && (puVar31[lVar39 + -1] != 0));
      lVar39 = lVar39 + 1) {
    LVar30 = BoxArray::numPts(*(BoxArray **)
                               ((long)&(((this->m_grids).
                                         super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                         .
                                         super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                       ).
                                       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar44 * 4));
    compactify(&result,this,
               (Box *)(*(long *)((long)&(((this->m_geom).
                                          super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                          .
                                          super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                        ).
                                        super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar44 * 4) +
                      0xac));
    LVar32 = Box::numPts(&result);
    puVar31 = (uint *)(this->m_domain_covered).super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start;
    puVar31[lVar39] = (uint)(LVar30 == LVar32);
    lVar44 = lVar44 + 6;
  }
  aggbox.smallend.vect[0] = 1;
  aggbox.smallend.vect[1] = 1;
  aggbox.smallend.vect[2] = 1;
  aggbox.bigend.vect[0] = 0;
  aggbox.bigend.vect[1] = 0;
  aggbox.bigend.vect[2] = 0;
  aggbox.btype.itype = 0;
  bVar24 = true;
  if ((this->info).do_agglomeration == true) {
    if (*puVar31 == 0) {
      BoxArray::minimalBox
                (&result,*(BoxArray **)
                          &(((local_308->
                             super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                             ).
                             super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                           super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>);
      aggbox.bigend.vect[1] = result.bigend.vect[1];
      aggbox.bigend.vect[2] = result.bigend.vect[2];
      aggbox.btype.itype = result.btype.itype;
      aggbox.smallend.vect[0] = result.smallend.vect[0];
      aggbox.smallend.vect[1] = result.smallend.vect[1];
      aggbox.smallend.vect[2] = result.smallend.vect[2];
      aggbox.bigend.vect[0] = result.bigend.vect[0];
      LVar30 = Box::numPts(&aggbox);
      bVar24 = LVar30 != LVar29;
    }
    else {
      lVar39 = *(long *)&(((this->m_geom).
                           super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                         super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
      aggbox.bigend.vect[1] = (int)((ulong)*(undefined8 *)(lVar39 + 0xb8) >> 0x20);
      aggbox._20_8_ = *(undefined8 *)(lVar39 + 0xc0);
      aggbox.smallend.vect._0_8_ = *(undefined8 *)(lVar39 + 0xac);
      aggbox.smallend.vect[2] = (int)*(undefined8 *)(lVar39 + 0xb4);
      aggbox.bigend.vect[0] = (int)((ulong)*(undefined8 *)(lVar39 + 0xb4) >> 0x20);
      uVar33 = (ulong)(uint)(this->info).hidden_direction;
      if (uVar33 < 3) {
        bVar24 = false;
        BoxArray::operator[]
                  (&result,*(BoxArray **)
                            &(((this->m_grids).
                               super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                             super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,0
                  );
        iVar43 = result.smallend.vect[(this->info).hidden_direction];
        aggbox.smallend.vect[uVar33] = iVar43;
        aggbox.bigend.vect[uVar33] = iVar43;
      }
      else {
        bVar24 = false;
      }
    }
  }
  if ((((this->info).do_semicoarsening == true) && ((uint)(this->info).hidden_direction < 3)) ||
     (3 < (this->info).semicoarsening_direction + 1U)) {
    Assert_host("! (info.do_semicoarsening && info.hasHiddenDimension()) && info.semicoarsening_direction >= -1 && info.semicoarsening_direction < AMREX_SPACEDIM"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLLinOp.cpp"
                ,299,(char *)0x0);
  }
  if (bVar24 || (this->info).do_agglomeration != true) {
    local_2f8 = 0.0;
    if ((this->info).do_consolidation == true) {
      dVar14 = BoxArray::d_numPts((((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                                   &local_300->
                                    super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>)->
                                  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                  )._M_impl.super__Vector_impl_data._M_start);
      local_2f8 = dVar14 / (double)*(int *)(DAT_006e0650 + -0x38);
      if ((anonymous_namespace)::consolidation_threshold == -1) {
        iVar43 = (this->info).con_grid_size;
        (anonymous_namespace)::consolidation_threshold = iVar43 * iVar43 * iVar43;
      }
    }
    pGVar3 = (a_geom->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
             super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
             super__Vector_impl_data._M_start;
    rr_vec.vect[0] = 1;
    rr_vec.vect[1] = 1;
    rr_vec.vect[2] = 1;
    local_2c0 = 0;
    iVar36 = 0;
    iVar43 = 0;
    bVar24 = false;
    while( true ) {
      if ((this->info).max_coarsening_level <= iVar43) break;
      rr_level.vect[2] = mg_coarsen_ratio_v.vect[2];
      rr_level.vect[0] = mg_coarsen_ratio_v.vect[0];
      rr_level.vect[1] = mg_coarsen_ratio_v.vect[1];
      bVar42 = iVar36 < (this->info).max_semicoarsening_level & (this->info).do_semicoarsening;
      if ((bVar42 == 1) && (lVar39 = (long)(this->info).semicoarsening_direction, lVar39 != -1)) {
        rr_level.vect[lVar39] = 1;
      }
      is_coarsenable.vect[0] = 0;
      is_coarsenable.vect[1] = 0;
      is_coarsenable.vect[2] = 0;
      for (lVar39 = 0; lVar39 != 3; lVar39 = lVar39 + 1) {
        result.smallend.vect[0] = 1;
        result.smallend.vect[1] = 1;
        result.smallend.vect[2] = 1;
        result.smallend.vect[lVar39] = rr_level.vect[lVar39] * rr_vec.vect[lVar39];
        bVar25 = Box::coarsenable(&pGVar3->domain,(IntVect *)&result,&mg_domain_min_width_v);
        uVar37 = 0;
        if (bVar25) {
          bVar25 = BoxArray::coarsenable
                             ((((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                               &local_300->
                                super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>)->
                              super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>)
                              ._M_impl.super__Vector_impl_data._M_start,(IntVect *)&result,
                              &mg_box_min_width_v);
          uVar37 = (uint)bVar25;
        }
        is_coarsenable.vect[lVar39] = uVar37;
        if ((bVar42 == 1 && (char)uVar37 == '\0') && ((this->info).semicoarsening_direction == -1))
        {
          is_coarsenable.vect[lVar39] = 1;
          rr_level.vect[lVar39] = 1;
        }
      }
      if (((is_coarsenable.vect[0] != 1) || (is_coarsenable.vect[1] != 1)) ||
         (is_coarsenable.vect[2] != 1)) break;
      if ((rr_level.vect[2] == 1 && (rr_level.vect[1] == 1 && rr_level.vect[0] == 1)) ||
         (((bVar42 & (this->info).semicoarsening_direction == -1) == 1 &&
          (1 < (byte)((rr_level.vect[2] == 1) + (rr_level.vect[1] == 1) + (rr_level.vect[0] == 1))))
         )) break;
      bVar25 = rr_level.vect[2] != iVar26;
      bVar15 = rr_level.vect[1] != local_2d4;
      bVar16 = rr_level.vect[0] != local_2d8;
      iVar38 = rr_level.vect[0] * rr_vec.vect[0];
      rr_vec.vect[1] = rr_level.vect[1] * rr_vec.vect[1];
      rr_vec.vect[0] = iVar38;
      rr_vec.vect[2] = rr_vec.vect[2] * rr_level.vect[2];
      this_01 = (vector<amrex::Geometry,std::allocator<amrex::Geometry>> *)
                (local_2a8->
                super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                ).
                super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar39 = *(long *)(pGVar3->domain).smallend.vect;
      lVar44 = *(long *)((pGVar3->domain).smallend.vect + 2);
      lVar12 = *(long *)(pGVar3->domain).bigend.vect;
      uVar18 = *(undefined8 *)((pGVar3->domain).bigend.vect + 2);
      result.bigend.vect[1] = (int)((ulong)lVar12 >> 0x20);
      result.bigend.vect[2] = (int)uVar18;
      result.btype.itype = SUB84(uVar18,4);
      result.smallend.vect[2] = (int)lVar44;
      result.bigend.vect[0] = (int)((ulong)lVar44 >> 0x20);
      result.smallend.vect[1] = (int)((ulong)lVar39 >> 0x20);
      uVar37 = result.smallend.vect[1];
      if (rr_vec.vect[1] == 1 && iVar38 == 1) {
        result.smallend.vect._0_8_ = lVar39;
        if (rr_vec.vect[2] != 1) goto LAB_004e8587;
      }
      else {
        result.smallend.vect[0] = (int)lVar39;
        if (iVar38 != 1) {
          if (iVar38 == 4) {
            if (result.smallend.vect[0] < 0) {
              result.smallend.vect[0] = result.smallend.vect[0] >> 2;
            }
            else {
              result.smallend.vect[0] = (uint)result.smallend.vect[0] >> 2;
            }
          }
          else if (iVar38 == 2) {
            if (result.smallend.vect[0] < 0) {
              result.smallend.vect[0] = result.smallend.vect[0] >> 1;
            }
            else {
              result.smallend.vect[0] = (uint)result.smallend.vect[0] >> 1;
            }
          }
          else if (result.smallend.vect[0] < 0) {
            result.smallend.vect[0] = ~(~result.smallend.vect[0] / iVar38);
          }
          else {
            result.smallend.vect[0] = result.smallend.vect[0] / iVar38;
          }
        }
        if (rr_vec.vect[1] != 1) {
          if (rr_vec.vect[1] == 4) {
            if (lVar39 < 0) {
              uVar37 = result.smallend.vect[1] >> 2;
            }
            else {
              uVar37 = (uint)result.smallend.vect[1] >> 2;
            }
          }
          else if (rr_vec.vect[1] == 2) {
            if (lVar39 < 0) {
              uVar37 = result.smallend.vect[1] >> 1;
            }
            else {
              uVar37 = (uint)result.smallend.vect[1] >> 1;
            }
          }
          else if (lVar39 < 0) {
            uVar37 = ~(~result.smallend.vect[1] / rr_vec.vect[1]);
          }
          else {
            uVar37 = result.smallend.vect[1] / rr_vec.vect[1];
          }
        }
LAB_004e8587:
        result.smallend.vect[1] = uVar37;
        if (rr_vec.vect[2] != 1) {
          if (rr_vec.vect[2] == 4) {
            if (result.smallend.vect[2] < 0) {
              result.smallend.vect[2] = result.smallend.vect[2] >> 2;
            }
            else {
              result.smallend.vect[2] = (uint)result.smallend.vect[2] >> 2;
            }
          }
          else if (rr_vec.vect[2] == 2) {
            if (result.smallend.vect[2] < 0) {
              result.smallend.vect[2] = result.smallend.vect[2] >> 1;
            }
            else {
              result.smallend.vect[2] = (uint)result.smallend.vect[2] >> 1;
            }
          }
          else if (result.smallend.vect[2] < 0) {
            result.smallend.vect[2] = ~(~result.smallend.vect[2] / rr_vec.vect[2]);
          }
          else {
            result.smallend.vect[2] = result.smallend.vect[2] / rr_vec.vect[2];
          }
        }
        result.btype.itype = SUB84(uVar18,4);
        result.bigend.vect[2] = (int)uVar18;
        if (result.btype.itype == 0) {
          uVar37 = result.bigend.vect[0];
          if (iVar38 != 1) {
            if (iVar38 == 4) {
              uVar37 = result.bigend.vect[0] >> 2;
              if (-1 < lVar44) {
                uVar37 = (uint)result.bigend.vect[0] >> 2;
              }
            }
            else if (iVar38 == 2) {
              uVar37 = result.bigend.vect[0] >> 1;
              if (-1 < lVar44) {
                uVar37 = (uint)result.bigend.vect[0] >> 1;
              }
            }
            else if (lVar44 < 0) {
              uVar37 = ~(~result.bigend.vect[0] / iVar38);
            }
            else {
              uVar37 = result.bigend.vect[0] / iVar38;
            }
          }
          uVar27 = result.bigend.vect[1];
          if (rr_vec.vect[1] != 1) {
            if (rr_vec.vect[1] == 4) {
              uVar27 = result.bigend.vect[1] >> 2;
              if (-1 < lVar12) {
                uVar27 = (uint)result.bigend.vect[1] >> 2;
              }
            }
            else if (rr_vec.vect[1] == 2) {
              uVar27 = result.bigend.vect[1] >> 1;
              if (-1 < lVar12) {
                uVar27 = (uint)result.bigend.vect[1] >> 1;
              }
            }
            else if (lVar12 < 0) {
              uVar27 = ~(~result.bigend.vect[1] / rr_vec.vect[1]);
            }
            else {
              uVar27 = result.bigend.vect[1] / rr_vec.vect[1];
            }
          }
          uVar28 = result.bigend.vect[2];
          result.bigend.vect[0] = uVar37;
          result.bigend.vect[1] = uVar27;
          if (rr_vec.vect[2] != 1) {
            if (rr_vec.vect[2] == 4) {
              uVar28 = result.bigend.vect[2] >> 2;
              if (-1 < result.bigend.vect[2]) {
                uVar28 = (uint)result.bigend.vect[2] >> 2;
              }
            }
            else if (rr_vec.vect[2] == 2) {
              uVar28 = result.bigend.vect[2] >> 1;
              if (-1 < result.bigend.vect[2]) {
                uVar28 = (uint)result.bigend.vect[2] >> 1;
              }
            }
            else if (result.bigend.vect[2] < 0) {
              uVar28 = ~(~result.bigend.vect[2] / rr_vec.vect[2]);
            }
            else {
              uVar28 = result.bigend.vect[2] / rr_vec.vect[2];
            }
          }
        }
        else {
          rr.vect[0] = 0;
          rr.vect[1] = 0;
          rr.vect[2] = 0;
          for (lVar39 = 0; lVar39 != 3; lVar39 = lVar39 + 1) {
            if (((result.btype.itype >> ((uint)lVar39 & 0x1f) & 1) != 0) &&
               (result.bigend.vect[lVar39] % rr_vec.vect[lVar39] != 0)) {
              rr.vect[lVar39] = 1;
            }
          }
          uVar37 = result.bigend.vect[0];
          if (iVar38 != 1) {
            if (iVar38 == 4) {
              uVar37 = result.bigend.vect[0] >> 2;
              if (-1 < lVar44) {
                uVar37 = (uint)result.bigend.vect[0] >> 2;
              }
            }
            else if (iVar38 == 2) {
              uVar37 = result.bigend.vect[0] >> 1;
              if (-1 < lVar44) {
                uVar37 = (uint)result.bigend.vect[0] >> 1;
              }
            }
            else if (lVar44 < 0) {
              uVar37 = ~(~result.bigend.vect[0] / iVar38);
            }
            else {
              uVar37 = result.bigend.vect[0] / iVar38;
            }
          }
          uVar27 = result.bigend.vect[1];
          if (rr_vec.vect[1] != 1) {
            if (rr_vec.vect[1] == 4) {
              uVar27 = result.bigend.vect[1] >> 2;
              if (-1 < lVar12) {
                uVar27 = (uint)result.bigend.vect[1] >> 2;
              }
            }
            else if (rr_vec.vect[1] == 2) {
              uVar27 = result.bigend.vect[1] >> 1;
              if (-1 < lVar12) {
                uVar27 = (uint)result.bigend.vect[1] >> 1;
              }
            }
            else if (lVar12 < 0) {
              uVar27 = ~(~result.bigend.vect[1] / rr_vec.vect[1]);
            }
            else {
              uVar27 = result.bigend.vect[1] / rr_vec.vect[1];
            }
          }
          uVar28 = result.bigend.vect[2];
          if (rr_vec.vect[2] != 1) {
            if (rr_vec.vect[2] == 4) {
              uVar28 = result.bigend.vect[2] >> 2;
              if (-1 < result.bigend.vect[2]) {
                uVar28 = (uint)result.bigend.vect[2] >> 2;
              }
            }
            else if (rr_vec.vect[2] == 2) {
              uVar28 = result.bigend.vect[2] >> 1;
              if (-1 < result.bigend.vect[2]) {
                uVar28 = (uint)result.bigend.vect[2] >> 1;
              }
            }
            else if (result.bigend.vect[2] < 0) {
              uVar28 = ~(~result.bigend.vect[2] / rr_vec.vect[2]);
            }
            else {
              uVar28 = result.bigend.vect[2] / rr_vec.vect[2];
            }
          }
          uVar28 = uVar28 + rr.vect[2];
          result.bigend.vect[0] = uVar37 + rr.vect[0];
          result.bigend.vect[1] = uVar27 + rr.vect[1];
        }
        result.bigend.vect[2] = uVar28;
      }
      std::vector<amrex::Geometry,std::allocator<amrex::Geometry>>::
      emplace_back<amrex::Box,amrex::RealBox_const&,int_const&,std::array<int,3ul>const&>
                (this_01,&result,__args_1,&coord,&local_220);
      pvVar6 = &((local_308->
                 super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                 ).
                 super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
                super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>;
      amrex::coarsen((BoxArray *)&result,
                     (((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                      &local_300->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>)->
                     super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>)._M_impl.
                     super__Vector_impl_data._M_start,&rr_vec);
      std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::emplace_back<amrex::BoxArray>
                (pvVar6,(BoxArray *)&result);
      BoxArray::~BoxArray((BoxArray *)&result);
      if ((this->info).do_consolidation == true) {
        pvVar7 = &((this_02->
                   super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                   ).
                   super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                  super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
        ;
        pDVar8 = (pvVar7->
                 super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if ((double)(anonymous_namespace)::consolidation_threshold * 0.999 <=
            local_2f8 / (double)(rr_vec.vect[1] * rr_vec.vect[0] * rr_vec.vect[2])) {
          std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
          push_back(pvVar7,pDVar8 + -1);
        }
        else {
          pDVar9 = (pvVar7->
                   super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          DistributionMapping::DistributionMapping((DistributionMapping *)&result);
          std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
          emplace_back<amrex::DistributionMapping>(pvVar7,(DistributionMapping *)&result);
          local_2c0 = (ulong)((long)pDVar8 - (long)pDVar9) >> 4;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(result.smallend.vect + 2));
          bVar24 = true;
        }
      }
      else {
        std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
        push_back(&((this_02->
                    super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                    ).
                    super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                   super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                  ,(a_dmap->
                   super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                   ).
                   super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      }
      iVar36 = iVar36 + (uint)(bVar25 || (bVar15 || bVar16));
      iVar43 = iVar43 + 1;
    }
    local_358._0_4_ = 0;
    local_2f8 = 0.0;
  }
  else {
    lVar39 = *(long *)&(((this->m_geom).
                         super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
    rr.vect._0_8_ = *(undefined8 *)(lVar39 + 0xac);
    unique0x100016d8 = *(undefined8 *)(lVar39 + 0xc0);
    auStack_33c[1] = (uint)((ulong)*(undefined8 *)(lVar39 + 0xb8) >> 0x20);
    rr.vect[2] = (int)*(undefined8 *)(lVar39 + 0xb4);
    auStack_33c[0] = (uint)((ulong)*(undefined8 *)(lVar39 + 0xb4) >> 0x20);
    auStack_31c[1] = aggbox.bigend.vect[1];
    auStack_31c[2] = aggbox.bigend.vect[2];
    IStack_310.itype = aggbox.btype.itype;
    rr_vec.vect[0] = aggbox.smallend.vect[0];
    rr_vec.vect[1] = aggbox.smallend.vect[1];
    rr_vec.vect[2] = aggbox.smallend.vect[2];
    auStack_31c[0] = aggbox.bigend.vect[0];
    plVar10 = *(long **)(*(long *)&(((this->m_grids).
                                     super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                     .
                                     super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                                   super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                        + 0x48);
    lVar44 = plVar10[1];
    lVar12 = *plVar10;
    iVar43 = (this->info).agg_grid_size;
    result.smallend.vect._0_8_ = *(undefined8 *)(lVar39 + 0xac);
    result._20_8_ = *(undefined8 *)(lVar39 + 0xc0);
    result.bigend.vect[1] = (int)((ulong)*(undefined8 *)(lVar39 + 0xb8) >> 0x20);
    result.smallend.vect[2] = (int)*(undefined8 *)(lVar39 + 0xb4);
    result.bigend.vect[0] = (int)((ulong)*(undefined8 *)(lVar39 + 0xb4) >> 0x20);
    __l._M_len = 1;
    __l._M_array = &result;
    std::vector<amrex::Box,_std::allocator<amrex::Box>_>::vector
              ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)&rr_level,__l,
               (allocator_type *)&is_coarsenable);
    result.bigend.vect[1] = auStack_31c[1];
    result.bigend.vect[2] = auStack_31c[2];
    result.btype.itype = IStack_310.itype;
    result.smallend.vect[0] = rr_vec.vect[0];
    result.smallend.vect[1] = rr_vec.vect[1];
    result.smallend.vect[2] = rr_vec.vect[2];
    result.bigend.vect[0] = auStack_31c[0];
    __l_00._M_len = 1;
    __l_00._M_array = &result;
    std::vector<amrex::Box,_std::allocator<amrex::Box>_>::vector
              ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)&is_coarsenable,__l_00,
               (allocator_type *)&agg_flag);
    result.smallend.vect._0_8_ = result.smallend.vect._0_8_ & 0xffffffff00000000;
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)&result;
    std::vector<int,_std::allocator<int>_>::vector
              (&agg_flag.super_vector<int,_std::allocator<int>_>,__l_01,
               (allocator_type *)&accum_coarsen_ratio);
    result.smallend.vect[0] = 1;
    result.smallend.vect[1] = 1;
    result.smallend.vect[2] = 1;
    __l_02._M_len = 1;
    __l_02._M_array = &result.smallend;
    std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::vector
              (&accum_coarsen_ratio.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,
               __l_02,(allocator_type *)&rr_level_1);
    local_2f8 = (double)((lVar44 - lVar12) / 0x1c);
    iVar38 = 0;
    for (iVar36 = 0; iVar36 < (this->info).max_coarsening_level; iVar36 = iVar36 + 1) {
      rr_level_1.vect[2] = mg_coarsen_ratio_v.vect[2];
      rr_level_1.vect[0] = mg_coarsen_ratio_v.vect[0];
      rr_level_1.vect[1] = mg_coarsen_ratio_v.vect[1];
      bVar42 = iVar38 < (this->info).max_semicoarsening_level & (this->info).do_semicoarsening;
      if ((bVar42 == 1) && (lVar39 = (long)(this->info).semicoarsening_direction, lVar39 != -1)) {
        rr_level_1.vect[lVar39] = 1;
      }
      is_coarsenable_1.vect[0] = 0;
      is_coarsenable_1.vect[1] = 0;
      is_coarsenable_1.vect[2] = 0;
      for (lVar39 = 0; iVar22 = rr_level_1.vect[2], lVar39 != 3; lVar39 = lVar39 + 1) {
        result.smallend.vect[0] = 1;
        result.smallend.vect[1] = 1;
        result.smallend.vect[2] = 1;
        result.smallend.vect[lVar39] = rr_level_1.vect[lVar39];
        bVar24 = Box::coarsenable((Box *)&rr,&result.smallend,&mg_domain_min_width_v);
        uVar37 = 0;
        if (bVar24) {
          bVar24 = Box::coarsenable((Box *)&rr_vec,&result.smallend,&mg_box_min_width_v);
          uVar37 = (uint)bVar24;
        }
        is_coarsenable_1.vect[lVar39] = uVar37;
        if ((bVar42 == 1 && (char)uVar37 == '\0') && ((this->info).semicoarsening_direction == -1))
        {
          is_coarsenable_1.vect[lVar39] = 1;
          rr_level_1.vect[lVar39] = 1;
        }
      }
      if (((is_coarsenable_1.vect[0] != 1) || (is_coarsenable_1.vect[1] != 1)) ||
         (is_coarsenable_1.vect[2] != 1)) break;
      iVar20 = rr_level_1.vect[0];
      iVar21 = rr_level_1.vect[1];
      bVar24 = rr_level_1.vect[1] == 1;
      bVar25 = rr_level_1.vect[0] == 1;
      if (((bVar24 && bVar25) && rr_level_1.vect[2] == 1) ||
         (((bVar42 & (this->info).semicoarsening_direction == -1) == 1 &&
          (1 < (byte)((rr_level_1.vect[2] == 1) +
                     (rr_level_1.vect[1] == 1) + (rr_level_1.vect[0] == 1)))))) break;
      bVar15 = rr_level_1.vect[2] != iVar26;
      bVar16 = rr_level_1.vect[1] != local_2d4;
      bVar17 = rr_level_1.vect[0] != local_2d8;
      result.smallend.vect[2] =
           accum_coarsen_ratio.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
           super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].vect[2] * rr_level_1.vect[2];
      result.smallend.vect[1] =
           accum_coarsen_ratio.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
           super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].vect[1] * rr_level_1.vect[1];
      result.smallend.vect[0] =
           accum_coarsen_ratio.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
           super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].vect[0] * rr_level_1.vect[0];
      std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::emplace_back<amrex::IntVect>
                (&accum_coarsen_ratio.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,
                 &result.smallend);
      uVar18 = rr.vect._0_8_;
      uVar37 = rr.vect[1];
      if (bVar24 && bVar25) {
        if (iVar22 != 1) goto LAB_004e8d47;
      }
      else {
        if (iVar20 != 1) {
          if (iVar20 == 4) {
            if (rr.vect[0] < 0) {
              rr.vect[0] = rr.vect[0] >> 2;
            }
            else {
              rr.vect[0] = (uint)rr.vect[0] >> 2;
            }
          }
          else if (iVar20 == 2) {
            if (rr.vect[0] < 0) {
              rr.vect[0] = rr.vect[0] >> 1;
            }
            else {
              rr.vect[0] = (uint)rr.vect[0] >> 1;
            }
          }
          else if (rr.vect[0] < 0) {
            rr.vect[0] = ~(~rr.vect[0] / iVar20);
          }
          else {
            rr.vect[0] = rr.vect[0] / iVar20;
          }
        }
        if (iVar21 != 1) {
          if (iVar21 == 4) {
            if ((long)uVar18 < 0) {
              uVar37 = rr.vect[1] >> 2;
            }
            else {
              uVar37 = (uint)rr.vect[1] >> 2;
            }
          }
          else if (iVar21 == 2) {
            if ((long)uVar18 < 0) {
              uVar37 = rr.vect[1] >> 1;
            }
            else {
              uVar37 = (uint)rr.vect[1] >> 1;
            }
          }
          else if ((long)uVar18 < 0) {
            uVar37 = ~(~rr.vect[1] / iVar21);
          }
          else {
            uVar37 = rr.vect[1] / iVar21;
          }
        }
LAB_004e8d47:
        rr.vect[1] = uVar37;
        if (iVar22 != 1) {
          if (iVar22 == 4) {
            if (rr.vect[2] < 0) {
              rr.vect[2] = rr.vect[2] >> 2;
            }
            else {
              rr.vect[2] = (uint)rr.vect[2] >> 2;
            }
          }
          else if (iVar22 == 2) {
            if (rr.vect[2] < 0) {
              rr.vect[2] = rr.vect[2] >> 1;
            }
            else {
              rr.vect[2] = (uint)rr.vect[2] >> 1;
            }
          }
          else if (rr.vect[2] < 0) {
            rr.vect[2] = ~(~rr.vect[2] / iVar22);
          }
          else {
            rr.vect[2] = rr.vect[2] / iVar22;
          }
        }
        if (IStack_330.itype == 0) {
          uVar37 = auStack_33c[0];
          if (iVar20 != 1) {
            if (iVar20 == 4) {
              uVar37 = (int)auStack_33c[0] >> 2;
              if (-1 < (int)auStack_33c[0]) {
                uVar37 = auStack_33c[0] >> 2;
              }
            }
            else if (iVar20 == 2) {
              uVar37 = (int)auStack_33c[0] >> 1;
              if (-1 < (int)auStack_33c[0]) {
                uVar37 = auStack_33c[0] >> 1;
              }
            }
            else if ((int)auStack_33c[0] < 0) {
              uVar37 = ~((int)~auStack_33c[0] / iVar20);
            }
            else {
              uVar37 = (int)auStack_33c[0] / iVar20;
            }
          }
          uVar27 = auStack_33c[1];
          if (iVar21 != 1) {
            if (iVar21 == 4) {
              uVar27 = (int)auStack_33c[1] >> 2;
              if (-1 < (int)auStack_33c[1]) {
                uVar27 = auStack_33c[1] >> 2;
              }
            }
            else if (iVar21 == 2) {
              uVar27 = (int)auStack_33c[1] >> 1;
              if (-1 < (int)auStack_33c[1]) {
                uVar27 = auStack_33c[1] >> 1;
              }
            }
            else if ((int)auStack_33c[1] < 0) {
              uVar27 = ~((int)~auStack_33c[1] / iVar21);
            }
            else {
              uVar27 = (int)auStack_33c[1] / iVar21;
            }
          }
          uVar28 = auStack_33c[2];
          auStack_33c[0] = uVar37;
          auStack_33c[1] = uVar27;
          if (iVar22 != 1) {
            if (iVar22 == 4) {
              uVar28 = (int)auStack_33c[2] >> 2;
              if (-1 < (int)auStack_33c[2]) {
                uVar28 = auStack_33c[2] >> 2;
              }
            }
            else if (iVar22 == 2) {
              uVar28 = (int)auStack_33c[2] >> 1;
              if (-1 < (int)auStack_33c[2]) {
                uVar28 = auStack_33c[2] >> 1;
              }
            }
            else if ((int)auStack_33c[2] < 0) {
              uVar28 = ~((int)~auStack_33c[2] / iVar22);
            }
            else {
              uVar28 = (int)auStack_33c[2] / iVar22;
            }
          }
        }
        else {
          result.smallend.vect[0] = 0;
          result.smallend.vect[1] = 0;
          result.smallend.vect[2] = 0;
          for (lVar39 = 0; lVar39 != 3; lVar39 = lVar39 + 1) {
            if (((IStack_330.itype >> ((uint)lVar39 & 0x1f) & 1) != 0) &&
               ((int)auStack_33c[lVar39] % rr_level_1.vect[lVar39] != 0)) {
              result.smallend.vect[lVar39] = 1;
            }
          }
          uVar37 = auStack_33c[0];
          if (iVar20 != 1) {
            if (iVar20 == 4) {
              uVar37 = (int)auStack_33c[0] >> 2;
              if (-1 < (int)auStack_33c[0]) {
                uVar37 = auStack_33c[0] >> 2;
              }
            }
            else if (iVar20 == 2) {
              uVar37 = (int)auStack_33c[0] >> 1;
              if (-1 < (int)auStack_33c[0]) {
                uVar37 = auStack_33c[0] >> 1;
              }
            }
            else if ((int)auStack_33c[0] < 0) {
              uVar37 = ~((int)~auStack_33c[0] / iVar20);
            }
            else {
              uVar37 = (int)auStack_33c[0] / iVar20;
            }
          }
          uVar27 = auStack_33c[1];
          if (iVar21 != 1) {
            if (iVar21 == 4) {
              uVar27 = (int)auStack_33c[1] >> 2;
              if (-1 < (int)auStack_33c[1]) {
                uVar27 = auStack_33c[1] >> 2;
              }
            }
            else if (iVar21 == 2) {
              uVar27 = (int)auStack_33c[1] >> 1;
              if (-1 < (int)auStack_33c[1]) {
                uVar27 = auStack_33c[1] >> 1;
              }
            }
            else if ((int)auStack_33c[1] < 0) {
              uVar27 = ~((int)~auStack_33c[1] / iVar21);
            }
            else {
              uVar27 = (int)auStack_33c[1] / iVar21;
            }
          }
          uVar28 = auStack_33c[2];
          if (iVar22 != 1) {
            if (iVar22 == 4) {
              uVar28 = (int)auStack_33c[2] >> 2;
              if (-1 < (int)auStack_33c[2]) {
                uVar28 = auStack_33c[2] >> 2;
              }
            }
            else if (iVar22 == 2) {
              uVar28 = (int)auStack_33c[2] >> 1;
              if (-1 < (int)auStack_33c[2]) {
                uVar28 = auStack_33c[2] >> 1;
              }
            }
            else if ((int)auStack_33c[2] < 0) {
              uVar28 = ~((int)~auStack_33c[2] / iVar22);
            }
            else {
              uVar28 = (int)auStack_33c[2] / iVar22;
            }
          }
          uVar28 = uVar28 + result.smallend.vect[2];
          auStack_33c[0] = uVar37 + result.smallend.vect[0];
          auStack_33c[1] = uVar27 + result.smallend.vect[1];
        }
        auStack_33c[2] = uVar28;
      }
      std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
                ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)&rr_level,(value_type *)&rr);
      uVar18 = rr_vec.vect._0_8_;
      uVar37 = rr_vec.vect[1];
      if (bVar24 && bVar25) {
        if (iVar22 != 1) goto LAB_004e8fc3;
      }
      else {
        if (iVar20 != 1) {
          if (iVar20 == 4) {
            if (rr_vec.vect[0] < 0) {
              rr_vec.vect[0] = rr_vec.vect[0] >> 2;
            }
            else {
              rr_vec.vect[0] = (uint)rr_vec.vect[0] >> 2;
            }
          }
          else if (iVar20 == 2) {
            if (rr_vec.vect[0] < 0) {
              rr_vec.vect[0] = rr_vec.vect[0] >> 1;
            }
            else {
              rr_vec.vect[0] = (uint)rr_vec.vect[0] >> 1;
            }
          }
          else if (rr_vec.vect[0] < 0) {
            rr_vec.vect[0] = ~(~rr_vec.vect[0] / iVar20);
          }
          else {
            rr_vec.vect[0] = rr_vec.vect[0] / iVar20;
          }
        }
        if (iVar21 != 1) {
          if (iVar21 == 4) {
            if ((long)uVar18 < 0) {
              uVar37 = rr_vec.vect[1] >> 2;
            }
            else {
              uVar37 = (uint)rr_vec.vect[1] >> 2;
            }
          }
          else if (iVar21 == 2) {
            if ((long)uVar18 < 0) {
              uVar37 = rr_vec.vect[1] >> 1;
            }
            else {
              uVar37 = (uint)rr_vec.vect[1] >> 1;
            }
          }
          else if ((long)uVar18 < 0) {
            uVar37 = ~(~rr_vec.vect[1] / iVar21);
          }
          else {
            uVar37 = rr_vec.vect[1] / iVar21;
          }
        }
LAB_004e8fc3:
        rr_vec.vect[1] = uVar37;
        if (iVar22 != 1) {
          if (iVar22 == 4) {
            if (rr_vec.vect[2] < 0) {
              rr_vec.vect[2] = rr_vec.vect[2] >> 2;
            }
            else {
              rr_vec.vect[2] = (uint)rr_vec.vect[2] >> 2;
            }
          }
          else if (iVar22 == 2) {
            if (rr_vec.vect[2] < 0) {
              rr_vec.vect[2] = rr_vec.vect[2] >> 1;
            }
            else {
              rr_vec.vect[2] = (uint)rr_vec.vect[2] >> 1;
            }
          }
          else if (rr_vec.vect[2] < 0) {
            rr_vec.vect[2] = ~(~rr_vec.vect[2] / iVar22);
          }
          else {
            rr_vec.vect[2] = rr_vec.vect[2] / iVar22;
          }
        }
        if (IStack_310.itype == 0) {
          uVar37 = auStack_31c[0];
          if (iVar20 != 1) {
            if (iVar20 == 4) {
              uVar37 = (int)auStack_31c[0] >> 2;
              if (-1 < (int)auStack_31c[0]) {
                uVar37 = auStack_31c[0] >> 2;
              }
            }
            else if (iVar20 == 2) {
              uVar37 = (int)auStack_31c[0] >> 1;
              if (-1 < (int)auStack_31c[0]) {
                uVar37 = auStack_31c[0] >> 1;
              }
            }
            else if ((int)auStack_31c[0] < 0) {
              uVar37 = ~((int)~auStack_31c[0] / iVar20);
            }
            else {
              uVar37 = (int)auStack_31c[0] / iVar20;
            }
          }
          uVar27 = auStack_31c[1];
          if (iVar21 != 1) {
            if (iVar21 == 4) {
              uVar27 = (int)auStack_31c[1] >> 2;
              if (-1 < (int)auStack_31c[1]) {
                uVar27 = auStack_31c[1] >> 2;
              }
            }
            else if (iVar21 == 2) {
              uVar27 = (int)auStack_31c[1] >> 1;
              if (-1 < (int)auStack_31c[1]) {
                uVar27 = auStack_31c[1] >> 1;
              }
            }
            else if ((int)auStack_31c[1] < 0) {
              uVar27 = ~((int)~auStack_31c[1] / iVar21);
            }
            else {
              uVar27 = (int)auStack_31c[1] / iVar21;
            }
          }
          uVar28 = auStack_31c[2];
          auStack_31c[0] = uVar37;
          auStack_31c[1] = uVar27;
          if (iVar22 != 1) {
            if (iVar22 == 4) {
              uVar28 = (int)auStack_31c[2] >> 2;
              if (-1 < (int)auStack_31c[2]) {
                uVar28 = auStack_31c[2] >> 2;
              }
            }
            else if (iVar22 == 2) {
              uVar28 = (int)auStack_31c[2] >> 1;
              if (-1 < (int)auStack_31c[2]) {
                uVar28 = auStack_31c[2] >> 1;
              }
            }
            else if ((int)auStack_31c[2] < 0) {
              uVar28 = ~((int)~auStack_31c[2] / iVar22);
            }
            else {
              uVar28 = (int)auStack_31c[2] / iVar22;
            }
          }
        }
        else {
          result.smallend.vect[0] = 0;
          result.smallend.vect[1] = 0;
          result.smallend.vect[2] = 0;
          for (lVar39 = 0; lVar39 != 3; lVar39 = lVar39 + 1) {
            if (((IStack_310.itype >> ((uint)lVar39 & 0x1f) & 1) != 0) &&
               ((int)auStack_31c[lVar39] % rr_level_1.vect[lVar39] != 0)) {
              result.smallend.vect[lVar39] = 1;
            }
          }
          uVar37 = auStack_31c[0];
          if (iVar20 != 1) {
            if (iVar20 == 4) {
              uVar37 = (int)auStack_31c[0] >> 2;
              if (-1 < (int)auStack_31c[0]) {
                uVar37 = auStack_31c[0] >> 2;
              }
            }
            else if (iVar20 == 2) {
              uVar37 = (int)auStack_31c[0] >> 1;
              if (-1 < (int)auStack_31c[0]) {
                uVar37 = auStack_31c[0] >> 1;
              }
            }
            else if ((int)auStack_31c[0] < 0) {
              uVar37 = ~((int)~auStack_31c[0] / iVar20);
            }
            else {
              uVar37 = (int)auStack_31c[0] / iVar20;
            }
          }
          uVar27 = auStack_31c[1];
          if (iVar21 != 1) {
            if (iVar21 == 4) {
              uVar27 = (int)auStack_31c[1] >> 2;
              if (-1 < (int)auStack_31c[1]) {
                uVar27 = auStack_31c[1] >> 2;
              }
            }
            else if (iVar21 == 2) {
              uVar27 = (int)auStack_31c[1] >> 1;
              if (-1 < (int)auStack_31c[1]) {
                uVar27 = auStack_31c[1] >> 1;
              }
            }
            else if ((int)auStack_31c[1] < 0) {
              uVar27 = ~((int)~auStack_31c[1] / iVar21);
            }
            else {
              uVar27 = (int)auStack_31c[1] / iVar21;
            }
          }
          uVar28 = auStack_31c[2];
          if (iVar22 != 1) {
            if (iVar22 == 4) {
              uVar28 = (int)auStack_31c[2] >> 2;
              if (-1 < (int)auStack_31c[2]) {
                uVar28 = auStack_31c[2] >> 2;
              }
            }
            else if (iVar22 == 2) {
              uVar28 = (int)auStack_31c[2] >> 1;
              if (-1 < (int)auStack_31c[2]) {
                uVar28 = auStack_31c[2] >> 1;
              }
            }
            else if ((int)auStack_31c[2] < 0) {
              uVar28 = ~((int)~auStack_31c[2] / iVar22);
            }
            else {
              uVar28 = (int)auStack_31c[2] / iVar22;
            }
          }
          uVar28 = uVar28 + result.smallend.vect[2];
          auStack_31c[0] = uVar37 + result.smallend.vect[0];
          auStack_31c[1] = uVar27 + result.smallend.vect[1];
        }
        auStack_31c[2] = uVar28;
      }
      std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
                ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)&is_coarsenable,
                 (value_type *)&rr_vec);
      dVar14 = Box::d_numPts((Box *)&rr_vec);
      result.smallend.vect[0] =
           (uint)(dVar14 / local_2f8 < (double)(iVar43 * iVar43 * iVar43) * 0.999);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                (&agg_flag.super_vector<int,_std::allocator<int>_>,(int *)&result);
      iVar38 = iVar38 + (uint)(bVar15 || (bVar16 || bVar17));
    }
    lVar39 = CONCAT44(uStack_25c,rr_level.vect[2]) - rr_level.vect._0_8_;
    local_358 = 0;
    uVar40 = 0;
    for (uVar33 = 1; (long)uVar33 < (long)(int)(lVar39 / 0x1c); uVar33 = uVar33 + 1) {
      if ((uVar40 == 0) &&
         (agg_flag.super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [uVar33] == 0)) {
        bVar24 = BoxArray::coarsenable
                           ((((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                             &local_300->
                              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>)->
                            super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                            _M_impl.super__Vector_impl_data._M_start,
                            accum_coarsen_ratio.
                            super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            _M_impl.super__Vector_impl_data._M_start + uVar33,&mg_box_min_width_v);
        if (!bVar24) goto LAB_004e945e;
        pvVar6 = &((local_308->
                   super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                   ).
                   super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                  super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>;
        amrex::coarsen((BoxArray *)&result,
                       (((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                        &local_300->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>)->
                       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                       _M_impl.super__Vector_impl_data._M_start,
                       accum_coarsen_ratio.
                       super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                       super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar33);
        std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::
        emplace_back<amrex::BoxArray>(pvVar6,(BoxArray *)&result);
        BoxArray::~BoxArray((BoxArray *)&result);
        std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
        push_back(&((this_02->
                    super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                    ).
                    super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                   super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                  ,(a_dmap->
                   super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                   ).
                   super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      }
      else {
LAB_004e945e:
        lVar44 = uVar33 * 0x1c;
        IVar45 = Box::length((Box *)(rr_level.vect._0_8_ + lVar44 + -0x1c));
        IVar46 = Box::length((Box *)(rr_level.vect._0_8_ + lVar44));
        rr_level_1.vect[2] = IVar45.vect[2] / IVar46.vect[2];
        rr_level_1.vect._0_8_ =
             (long)((ulong)(uint)(IVar45.vect[1] >> 0x1f) << 0x20 | IVar45.vect._0_8_ >> 0x20) /
             (long)IVar46.vect[1] << 0x20 |
             (long)((ulong)(uint)(IVar45.vect[0] >> 0x1f) << 0x20 | IVar45.vect._0_8_ & 0xffffffff)
             / (long)IVar46.vect[0] & 0xffffffffU;
        bVar24 = BoxArray::coarsenable
                           ((((local_308->
                              super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                              ).
                              super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                            super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                            _M_impl.super__Vector_impl_data._M_finish + -1,&rr_level_1,1);
        if (!bVar24) break;
        std::vector<amrex::BoxArray,std::allocator<amrex::BoxArray>>::emplace_back<amrex::Box&>
                  ((vector<amrex::BoxArray,std::allocator<amrex::BoxArray>> *)
                   (local_308->
                   super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                   ).
                   super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (Box *)(is_coarsenable.vect._0_8_ + lVar44));
        is_coarsenable_1.vect[1] = (this->info).agg_grid_size;
        is_coarsenable_1.vect[0] = is_coarsenable_1.vect[1];
        is_coarsenable_1.vect[2] = is_coarsenable_1.vect[1];
        if ((((this->info).do_semicoarsening == true) &&
            ((long)uVar33 <= (long)(this->info).max_semicoarsening_level)) &&
           ((this->info).semicoarsening_direction != -1)) {
          puVar1 = (undefined8 *)(is_coarsenable.vect._0_8_ + 0xc + lVar44);
          uVar18 = *puVar1;
          result.smallend.vect._0_8_ = *(undefined8 *)(is_coarsenable.vect._0_8_ + lVar44);
          result.smallend.vect[2] =
               (int)*(undefined8 *)((int *)(is_coarsenable.vect._0_8_ + lVar44) + 2);
          result.bigend.vect[0] = (int)uVar18;
          result.bigend.vect[1] = (int)((ulong)uVar18 >> 0x20);
          result._20_8_ = puVar1[1];
          for (lVar44 = 0; lVar44 != 3; lVar44 = lVar44 + 1) {
            if ((result.btype.itype >> ((uint)lVar44 & 0x1f) & 1) != 0) {
              piVar2 = result.bigend.vect + lVar44;
              *piVar2 = *piVar2 + -1;
            }
          }
          result._20_8_ = result._20_8_ & 0xffffffff;
          IVar45 = Box::size(&result);
          iVar26 = (this->info).semicoarsening_direction;
          is_coarsenable_1.vect[iVar26] =
               ((IVar45.vect[1] + is_coarsenable_1.vect[1] + -1) / IVar45.vect[1]) *
               ((is_coarsenable_1.vect[0] + IVar45.vect[0] + -1) / IVar45.vect[0]) *
               ((is_coarsenable_1.vect[2] + IVar45.vect[2] + -1) / IVar45.vect[2]) *
               is_coarsenable_1.vect[iVar26];
        }
        BoxArray::maxSize((((local_308->
                            super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                            ).
                            super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                          super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                          _M_impl.super__Vector_impl_data._M_finish + -1,&is_coarsenable_1);
        pvVar7 = &((this_02->
                   super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                   ).
                   super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                  super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
        ;
        DistributionMapping::DistributionMapping((DistributionMapping *)&result);
        std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
        emplace_back<amrex::DistributionMapping>(pvVar7,(DistributionMapping *)&result);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(result.smallend.vect + 2));
        if (uVar40 == 0) {
          local_358 = uVar33;
        }
        local_358 = local_358 & 0xffffffff;
        if (uVar40 == 0) {
          uVar40 = 1;
        }
      }
      std::vector<amrex::Geometry,std::allocator<amrex::Geometry>>::
      emplace_back<amrex::Box&,amrex::RealBox_const&,int_const&,std::array<int,3ul>const&>
                ((vector<amrex::Geometry,std::allocator<amrex::Geometry>> *)
                 (local_2a8->
                 super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                 ).
                 super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (Box *)(uVar33 * 0x1c + rr_level.vect._0_8_),__args_1,&coord,&local_220);
    }
    local_2f8 = (double)uVar40;
    std::_Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~_Vector_base
              ((_Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)&accum_coarsen_ratio
              );
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&agg_flag);
    std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
              ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&is_coarsenable);
    std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
              ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&rr_level);
    local_2c0._0_4_ = 0;
    bVar24 = false;
  }
  pVVar11 = (this->m_grids).
            super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
            .
            super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar33 = ((long)(pVVar11->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                  super__Vector_impl_data._M_finish -
           *(long *)&(pVVar11->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                     super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>) / 0x68;
  *(this->m_num_mg_levels).super_vector<int,_std::allocator<int>_>.
   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int)uVar33;
  local_300 = &this->mg_coarsen_ratio_vec;
  lVar44 = 0x174;
  for (lVar39 = 0; lVar39 < (int)uVar33 + -1; lVar39 = lVar39 + 1) {
    lVar12 = *(long *)&(((local_2a8->
                         super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                         ).
                         super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
    IVar45 = Box::length((Box *)(lVar44 + lVar12 + -200));
    IVar46 = Box::length((Box *)(lVar12 + lVar44));
    result.smallend.vect[2] = IVar45.vect[2] / IVar46.vect[2];
    result.smallend.vect._0_8_ =
         (long)((ulong)(uint)(IVar45.vect[1] >> 0x1f) << 0x20 | IVar45.vect._0_8_ >> 0x20) /
         (long)IVar46.vect[1] << 0x20 |
         (long)((ulong)(uint)(IVar45.vect[0] >> 0x1f) << 0x20 | IVar45.vect._0_8_ & 0xffffffff) /
         (long)IVar46.vect[0] & 0xffffffffU;
    std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::emplace_back<amrex::IntVect>
              (&local_300->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,
               &result.smallend);
    uVar33 = (ulong)(uint)*(local_2a0->super_vector<int,_std::allocator<int>_>).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
    lVar44 = lVar44 + 200;
  }
  for (lVar39 = 0; lVar39 < this->m_num_amr_levels; lVar39 = lVar39 + 1) {
    if (((this->m_amr_ref_ratio).super_vector<int,_std::allocator<int>_>.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         [lVar39] == 4) &&
       ((this->mg_coarsen_ratio_vec).super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
        super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (this->mg_coarsen_ratio_vec).super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
        super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
        super__Vector_impl_data._M_start)) {
      result.smallend.vect._0_8_ = &DAT_200000002;
      result.smallend.vect[2] = 2;
      std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::emplace_back<amrex::IntVect>
                (&local_300->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,
                 &result.smallend);
    }
  }
  if (((ulong)local_2f8 & 1) == 0) {
    if (bVar24) {
      makeConsolidatedDMap
                ((local_308->
                 super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                 ).
                 super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (this_02->
                 super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                 ).
                 super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (anonymous_namespace)::consolidation_ratio,
                 (anonymous_namespace)::consolidation_strategy);
    }
  }
  else {
    makeAgglomeratedDMap
              ((local_308->
               super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
               ).
               super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (this_02->
               super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
               ).
               super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  this->m_bottom_comm = this->m_default_comm;
  this->m_do_agglomeration = (bool)(SUB81(local_2f8,0) & 1);
  this->m_do_consolidation = bVar24;
  if ((anonymous_namespace)::flag_verbose_linop != 0) {
    if (((ulong)local_2f8 & 1) == 0) {
      if (bVar24) {
        poVar34 = OutStream();
        Print::Print((Print *)&result,poVar34);
        poVar34 = (ostream *)(result.bigend.vect + 1);
        std::operator<<(poVar34,
                        "MLLinOp::defineGrids(): consolidated AMR level 0 starting at MG level ");
        std::ostream::operator<<(poVar34,(int)local_2c0);
        std::operator<<(poVar34," of ");
        pPVar35 = Print::operator<<((Print *)&result,
                                    (local_2a0->super_vector<int,_std::allocator<int>_>).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
        std::operator<<((ostream *)&pPVar35->ss," (ratio = ");
        pPVar35 = Print::operator<<(pPVar35,&(anonymous_namespace)::consolidation_ratio);
        std::operator<<((ostream *)&pPVar35->ss,")");
        std::endl<char,std::char_traits<char>>((ostream *)&pPVar35->ss);
      }
      else {
        poVar34 = OutStream();
        Print::Print((Print *)&result,poVar34);
        poVar34 = (ostream *)(result.bigend.vect + 1);
        std::operator<<(poVar34,
                        "MLLinOp::defineGrids(): no agglomeration or consolidation of AMR level 0");
        std::endl<char,std::char_traits<char>>(poVar34);
      }
    }
    else {
      poVar34 = OutStream();
      Print::Print((Print *)&result,poVar34);
      poVar34 = (ostream *)(result.bigend.vect + 1);
      std::operator<<(poVar34,
                      "MLLinOp::defineGrids(): agglomerated AMR level 0 starting at MG level ");
      std::ostream::operator<<(poVar34,(int)local_358);
      std::operator<<(poVar34," of ");
      pPVar35 = Print::operator<<((Print *)&result,
                                  (local_2a0->super_vector<int,_std::allocator<int>_>).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
      std::endl<char,std::char_traits<char>>((ostream *)&pPVar35->ss);
    }
    Print::~Print((Print *)&result);
  }
  for (uVar33 = 0; (long)uVar33 < (long)this->m_num_amr_levels; uVar33 = uVar33 + 1) {
    for (uVar37 = 1;
        (int)uVar37 <
        (local_2a0->super_vector<int,_std::allocator<int>_>).
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [uVar33]; uVar37 = uVar37 + 1) {
      pVVar13 = (this->m_factory).
                super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                .
                super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      (*this->_vptr_MLLinOp[0x42])(&result,this,uVar33 & 0xffffffff,(ulong)uVar37);
      std::
      vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>,std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>>
      ::
      emplace_back<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>
                ((vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>,std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>>
                  *)(pVVar13 + uVar33),
                 (unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                  *)&result);
      if (result.smallend.vect._0_8_ != 0) {
        (**(code **)(*(long *)result.smallend.vect._0_8_ + 8))();
      }
    }
  }
  return;
}

Assistant:

void
MLLinOp::defineGrids (const Vector<Geometry>& a_geom,
                      const Vector<BoxArray>& a_grids,
                      const Vector<DistributionMapping>& a_dmap,
                      const Vector<FabFactory<FArrayBox> const*>& a_factory)
{
    BL_PROFILE("MLLinOp::defineGrids()");

    m_num_amr_levels = a_geom.size();

    m_amr_ref_ratio.resize(m_num_amr_levels);
    m_num_mg_levels.resize(m_num_amr_levels);

    m_geom.resize(m_num_amr_levels);
    m_grids.resize(m_num_amr_levels);
    m_dmap.resize(m_num_amr_levels);
    m_factory.resize(m_num_amr_levels);

    m_default_comm = ParallelContext::CommunicatorSub();

    const RealBox& rb = a_geom[0].ProbDomain();
    const int coord = a_geom[0].Coord();
    const Array<int,AMREX_SPACEDIM>& is_per = a_geom[0].isPeriodic();

    IntVect mg_coarsen_ratio_v(mg_coarsen_ratio);
    IntVect mg_box_min_width_v(mg_box_min_width);
    IntVect mg_domain_min_width_v(mg_domain_min_width);
    if (hasHiddenDimension()) {
        AMREX_ALWAYS_ASSERT_WITH_MESSAGE(AMREX_SPACEDIM == 3 && m_num_amr_levels == 1,
                                         "Hidden direction only supported for 3d level solve");
        mg_coarsen_ratio_v[info.hidden_direction] = 1;
        mg_box_min_width_v[info.hidden_direction] = 0;
        mg_domain_min_width_v[info.hidden_direction] = 0;
    }

    // fine amr levels
    for (int amrlev = m_num_amr_levels-1; amrlev > 0; --amrlev)
    {
        m_num_mg_levels[amrlev] = 1;
        m_geom[amrlev].push_back(a_geom[amrlev]);
        m_grids[amrlev].push_back(a_grids[amrlev]);
        m_dmap[amrlev].push_back(a_dmap[amrlev]);
        if (amrlev < a_factory.size()) {
            m_factory[amrlev].emplace_back(a_factory[amrlev]->clone());
        } else {
            m_factory[amrlev].push_back(std::make_unique<FArrayBoxFactory>());
        }

        IntVect rr = mg_coarsen_ratio_v;
        const Box& dom = a_geom[amrlev].Domain();
        for (int i = 0; i < 2; ++i)
        {
            if (!dom.coarsenable(rr)) amrex::Abort("MLLinOp: Uncoarsenable domain");

            const Box& cdom = amrex::coarsen(dom,rr);
            if (cdom == a_geom[amrlev-1].Domain()) break;

            ++(m_num_mg_levels[amrlev]);

            m_geom[amrlev].emplace_back(cdom, rb, coord, is_per);

            m_grids[amrlev].push_back(a_grids[amrlev]);
            AMREX_ASSERT(m_grids[amrlev].back().coarsenable(rr));
            m_grids[amrlev].back().coarsen(rr);

            m_dmap[amrlev].push_back(a_dmap[amrlev]);

            rr *= mg_coarsen_ratio_v;
        }

        if (hasHiddenDimension()) {
            m_amr_ref_ratio[amrlev-1] = rr[AMREX_SPACEDIM-info.hidden_direction];
        } else {
            m_amr_ref_ratio[amrlev-1] = rr[0];
        }
    }

    // coarsest amr level
    m_num_mg_levels[0] = 1;
    m_geom[0].push_back(a_geom[0]);
    m_grids[0].push_back(a_grids[0]);
    m_dmap[0].push_back(a_dmap[0]);
    if (a_factory.size() > 0) {
        m_factory[0].emplace_back(a_factory[0]->clone());
    } else {
        m_factory[0].push_back(std::make_unique<FArrayBoxFactory>());
    }

    m_domain_covered.resize(m_num_amr_levels, false);
    auto npts0 = m_grids[0][0].numPts();
    m_domain_covered[0] = (npts0 == compactify(m_geom[0][0].Domain()).numPts());
    for (int amrlev = 1; amrlev < m_num_amr_levels; ++amrlev)
    {
        if (!m_domain_covered[amrlev-1]) break;
        m_domain_covered[amrlev] = (m_grids[amrlev][0].numPts() ==
                                    compactify(m_geom[amrlev][0].Domain()).numPts());
    }

    Box aggbox;
    bool aggable = false;

    if (info.do_agglomeration)
    {
        if (m_domain_covered[0])
        {
            aggbox = m_geom[0][0].Domain();
            if (hasHiddenDimension()) {
                aggbox.makeSlab(hiddenDirection(), m_grids[0][0][0].smallEnd(hiddenDirection()));
            }
            aggable = true;
        }
        else
        {
            aggbox = m_grids[0][0].minimalBox();
            aggable = (aggbox.numPts() == npts0);
        }
    }

    bool agged = false;
    bool coned = false;
    int agg_lev = 0, con_lev = 0;

    AMREX_ALWAYS_ASSERT( ! (info.do_semicoarsening && info.hasHiddenDimension())
                         && info.semicoarsening_direction >= -1
                         && info.semicoarsening_direction < AMREX_SPACEDIM );

    if (info.do_agglomeration && aggable)
    {
        Box dbx = m_geom[0][0].Domain();
        Box bbx = aggbox;
        Real const nbxs = static_cast<Real>(m_grids[0][0].size());
        Real const threshold_npts = static_cast<Real>(AMREX_D_TERM(info.agg_grid_size,
                                                                  *info.agg_grid_size,
                                                                  *info.agg_grid_size));
        Vector<Box> domainboxes{dbx};
        Vector<Box> boundboxes{bbx};
        Vector<int> agg_flag{false};
        Vector<IntVect> accum_coarsen_ratio{IntVect(1)};
        int numsclevs = 0;

        for (int lev = 0; lev < info.max_coarsening_level; ++lev)
        {
            IntVect rr_level = mg_coarsen_ratio_v;
            bool const do_semicoarsening_level = info.do_semicoarsening
                && numsclevs < info.max_semicoarsening_level;
            if (do_semicoarsening_level
                && info.semicoarsening_direction != -1)
            {
                rr_level[info.semicoarsening_direction] = 1;
            }
            IntVect is_coarsenable;
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                IntVect rr_dir(1);
                rr_dir[idim] = rr_level[idim];
                is_coarsenable[idim] = dbx.coarsenable(rr_dir, mg_domain_min_width_v)
                    && bbx.coarsenable(rr_dir, mg_box_min_width_v);
                if (!is_coarsenable[idim] && do_semicoarsening_level
                    && info.semicoarsening_direction == -1)
                {
                    is_coarsenable[idim] = true;
                    rr_level[idim] = 1;
                }
            }
            if (is_coarsenable != IntVect(1) || rr_level == IntVect(1)) {
                break;
            }
            if (do_semicoarsening_level && info.semicoarsening_direction == -1) {
                // make sure there is at most one direction that is not coarsened
                int n_ones = AMREX_D_TERM(  static_cast<int>(rr_level[0] == 1),
                                          + static_cast<int>(rr_level[1] == 1),
                                          + static_cast<int>(rr_level[2] == 1));
                if (n_ones > 1) { break; }
            }
            if (rr_level != mg_coarsen_ratio_v) {
                ++numsclevs;
            }

            accum_coarsen_ratio.push_back(accum_coarsen_ratio.back()*rr_level);
            domainboxes.push_back(dbx.coarsen(rr_level));
            boundboxes.push_back(bbx.coarsen(rr_level));
            bool to_agg = (bbx.d_numPts() / nbxs) < 0.999*threshold_npts;
            agg_flag.push_back(to_agg);
        }

        for (int lev = 1, nlevs = domainboxes.size(); lev < nlevs; ++lev) {
            if (!agged && !agg_flag[lev] &&
                a_grids[0].coarsenable(accum_coarsen_ratio[lev], mg_box_min_width_v))
            {
                m_grids[0].push_back(amrex::coarsen(a_grids[0], accum_coarsen_ratio[lev]));
                m_dmap[0].push_back(a_dmap[0]);
            } else {
                IntVect cr = domainboxes[lev-1].length() / domainboxes[lev].length();
                if (!m_grids[0].back().coarsenable(cr)) {
                    break; // average_down would fail if fine boxarray is not coarsenable.
                }
                m_grids[0].emplace_back(boundboxes[lev]);
                IntVect max_grid_size(info.agg_grid_size);
                if (info.do_semicoarsening && info.max_semicoarsening_level >= lev
                    && info.semicoarsening_direction != -1)
                {
                    IntVect blen = amrex::enclosedCells(boundboxes[lev]).size();
                    AMREX_D_TERM(int mgs_0 = (max_grid_size[0]+blen[0]-1) / blen[0];,
                                 int mgs_1 = (max_grid_size[1]+blen[1]-1) / blen[1];,
                                 int mgs_2 = (max_grid_size[2]+blen[2]-1) / blen[2]);
                    max_grid_size[info.semicoarsening_direction]
                        *= AMREX_D_TERM(mgs_0, *mgs_1, *mgs_2);
                }
                m_grids[0].back().maxSize(max_grid_size);
                m_dmap[0].push_back(DistributionMapping());
                if (!agged) {
                    agged = true;
                    agg_lev = lev;
                }
            }
            m_geom[0].emplace_back(domainboxes[lev],rb,coord,is_per);
        }
    }
    else
    {
        Real avg_npts = 0.0;
        if (info.do_consolidation) {
            avg_npts = static_cast<Real>(a_grids[0].d_numPts()) / static_cast<Real>(ParallelContext::NProcsSub());
            if (consolidation_threshold == -1) {
                consolidation_threshold = AMREX_D_TERM(info.con_grid_size,
                                                      *info.con_grid_size,
                                                      *info.con_grid_size);
            }
        }

        Box const& dom0 = a_geom[0].Domain();
        IntVect rr_vec(1);
        int numsclevs = 0;
        for (int lev = 0; lev < info.max_coarsening_level; ++lev)
        {
            IntVect rr_level = mg_coarsen_ratio_v;
            bool do_semicoarsening_level = info.do_semicoarsening
                && numsclevs < info.max_semicoarsening_level;
            if (do_semicoarsening_level
                && info.semicoarsening_direction != -1)
            {
                rr_level[info.semicoarsening_direction] = 1;
            }
            IntVect is_coarsenable;
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                IntVect rr_dir(1);
                rr_dir[idim] = rr_vec[idim] * rr_level[idim];
                is_coarsenable[idim] = dom0.coarsenable(rr_dir, mg_domain_min_width_v)
                    && a_grids[0].coarsenable(rr_dir, mg_box_min_width_v);
                if (!is_coarsenable[idim] && do_semicoarsening_level
                    && info.semicoarsening_direction == -1)
                {
                    is_coarsenable[idim] = true;
                    rr_level[idim] = 1;
                }
            }
            if (is_coarsenable != IntVect(1) || rr_level == IntVect(1)) {
                break;
            }
            if (do_semicoarsening_level && info.semicoarsening_direction == -1) {
                // make sure there is at most one direction that is not coarsened
                int n_ones = AMREX_D_TERM(  static_cast<int>(rr_level[0] == 1),
                                          + static_cast<int>(rr_level[1] == 1),
                                          + static_cast<int>(rr_level[2] == 1));
                if (n_ones > 1) { break; }
            }
            if (rr_level != mg_coarsen_ratio_v) {
                ++numsclevs;
            }
            rr_vec *= rr_level;

            m_geom[0].emplace_back(amrex::coarsen(dom0, rr_vec), rb, coord, is_per);
            m_grids[0].push_back(amrex::coarsen(a_grids[0], rr_vec));

            if (info.do_consolidation)
            {
                if (avg_npts/(AMREX_D_TERM(rr_vec[0], *rr_vec[1], *rr_vec[2]))
                    < Real(0.999)*consolidation_threshold)
                {
                    coned = true;
                    con_lev = m_dmap[0].size();
                    m_dmap[0].push_back(DistributionMapping());
                }
                else
                {
                    m_dmap[0].push_back(m_dmap[0].back());
                }
            }
            else
            {
                m_dmap[0].push_back(a_dmap[0]);
            }
        }
    }

    m_num_mg_levels[0] = m_grids[0].size();

    for (int mglev = 0; mglev < m_num_mg_levels[0] - 1; mglev++){
        const Box& fine_domain = m_geom[0][mglev].Domain();
        const Box& crse_domain = m_geom[0][mglev+1].Domain();
        mg_coarsen_ratio_vec.push_back(fine_domain.length()/crse_domain.length());
    }

    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev) {
        if (AMRRefRatio(amrlev) == 4 && mg_coarsen_ratio_vec.size() == 0) {
            mg_coarsen_ratio_vec.push_back(IntVect(2));
        }
    }

    if (agged)
    {
        makeAgglomeratedDMap(m_grids[0], m_dmap[0]);
    }
    else if (coned)
    {
        makeConsolidatedDMap(m_grids[0], m_dmap[0], consolidation_ratio, consolidation_strategy);
    }

    if (flag_use_mota && (agged || coned))
    {
        remapNeighborhoods(m_dmap[0]);
    }

    if (agged || coned)
    {
        m_bottom_comm = makeSubCommunicator(m_dmap[0].back());
    }
    else
    {
        m_bottom_comm = m_default_comm;
    }

    m_do_agglomeration = agged;
    m_do_consolidation = coned;

    if (flag_verbose_linop) {
        if (agged) {
            Print() << "MLLinOp::defineGrids(): agglomerated AMR level 0 starting at MG level "
                    << agg_lev << " of " << m_num_mg_levels[0] << std::endl;
        } else if (coned) {
            Print() << "MLLinOp::defineGrids(): consolidated AMR level 0 starting at MG level "
                    << con_lev << " of " << m_num_mg_levels[0]
                    << " (ratio = " << consolidation_ratio << ")" << std::endl;
        } else {
            Print() << "MLLinOp::defineGrids(): no agglomeration or consolidation of AMR level 0" << std::endl;
        }
    }

    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev)
    {
        for (int mglev = 1; mglev < m_num_mg_levels[amrlev]; ++mglev)
        {
            m_factory[amrlev].emplace_back(makeFactory(amrlev,mglev));
        }
    }

    for (int amrlev = 1; amrlev < m_num_amr_levels; ++amrlev)
    {
        AMREX_ASSERT_WITH_MESSAGE(m_grids[amrlev][0].coarsenable(m_amr_ref_ratio[amrlev-1]),
                                  "MLLinOp: grids not coarsenable between AMR levels");
    }
}